

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  byte bVar1;
  ushort uVar2;
  uint8_t uVar3;
  uint uVar4;
  Reg RVar5;
  long lVar6;
  long lVar7;
  
  (as->mrm).idx = 0x80;
  if ((ir->field_0).op1 == 0x7fff) {
    uVar4 = (uint)(ir->field_0).op2 * 4;
LAB_0013ae25:
    (as->mrm).ofs = uVar4 - 0xfe0;
  }
  else {
    bVar1 = "\x14\x10 \nH \x10(04\n \n008@HPX\n\x10\x10\x10\x14"[(ir->field_0).op2];
    (as->mrm).ofs = (uint)bVar1;
    uVar2 = (ir->field_0).op1;
    lVar6 = (long)(short)uVar2;
    if (lVar6 < 0) {
LAB_0013ae65:
      RVar5 = ra_alloc1(as,(uint)uVar2,allow);
      uVar3 = (uint8_t)RVar5;
      goto LAB_0013ae70;
    }
    uVar4 = (uint)bVar1;
    if (uVar2 == 0x7fff) goto LAB_0013ae25;
    if ((1 < (byte)(*(char *)((long)as->ir + lVar6 * 8 + 5) - 0x19U)) ||
       (lVar6 = (long)as->ir[lVar6 + 1] - (long)as->J, lVar7 = (ulong)(uint)bVar1 + lVar6 + -0xca8,
       (int)lVar7 != lVar7)) goto LAB_0013ae65;
    (as->mrm).ofs = (int)lVar6 + -0xca8 + uVar4;
  }
  uVar3 = '\x0e';
LAB_0013ae70:
  (as->mrm).base = uVar3;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lj_assertA(ir->o == IR_FLOAD || ir->o == IR_FREF,
	     "bad IR op %d", ir->o);
  as->mrm.idx = RID_NONE;
  if (ir->op1 == REF_NIL) {  /* FLOAD from GG_State with offset. */
#if LJ_GC64
    as->mrm.ofs = (int32_t)(ir->op2 << 2) - GG_OFS(dispatch);
    as->mrm.base = RID_DISPATCH;
#else
    as->mrm.ofs = (int32_t)(ir->op2 << 2) + ptr2addr(J2GG(as->J));
    as->mrm.base = RID_NONE;
#endif
    return;
  }
  as->mrm.ofs = field_ofs[ir->op2];
  if (irref_isk(ir->op1)) {
    IRIns *op1 = IR(ir->op1);
#if LJ_GC64
    if (ir->op1 == REF_NIL) {
      as->mrm.ofs -= GG_OFS(dispatch);
      as->mrm.base = RID_DISPATCH;
      return;
    } else if (op1->o == IR_KPTR || op1->o == IR_KKPTR) {
      intptr_t ofs = dispofs(as, ir_kptr(op1));
      if (checki32(as->mrm.ofs + ofs)) {
	as->mrm.ofs += (int32_t)ofs;
	as->mrm.base = RID_DISPATCH;
	return;
      }
    }
#else
    as->mrm.ofs += op1->i;
    as->mrm.base = RID_NONE;
    return;
#endif
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
}